

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O1

void __thiscall
icu_63::RuleBasedTimeZone::addTransitionRule
          (RuleBasedTimeZone *this,TimeZoneRule *rule,UErrorCode *status)

{
  int32_t iVar1;
  AnnualTimeZoneRule *this_00;
  UVector *this_01;
  pointer_____offset_0x10___ *size;
  UVector **ppUVar2;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if (rule == (TimeZoneRule *)0x0) {
    this_00 = (AnnualTimeZoneRule *)0x0;
    size = (pointer_____offset_0x10___ *)0x0;
  }
  else {
    size = &TimeZoneRule::typeinfo;
    this_00 = (AnnualTimeZoneRule *)
              __dynamic_cast(rule,&TimeZoneRule::typeinfo,&AnnualTimeZoneRule::typeinfo,0);
  }
  if ((this_00 == (AnnualTimeZoneRule *)0x0) ||
     (iVar1 = AnnualTimeZoneRule::getEndYear(this_00), iVar1 != 0x7fffffff)) {
    ppUVar2 = &this->fHistoricRules;
    if (this->fHistoricRules != (UVector *)0x0) goto LAB_001f5c54;
    this_01 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
    if (this_01 == (UVector *)0x0) goto LAB_001f5c48;
    UVector::UVector(this_01,status);
  }
  else {
    ppUVar2 = &this->fFinalRules;
    if (this->fFinalRules != (UVector *)0x0) {
      if (1 < this->fFinalRules->count) {
        *status = U_INVALID_STATE_ERROR;
        return;
      }
      goto LAB_001f5c54;
    }
    this_01 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
    if (this_01 == (UVector *)0x0) {
LAB_001f5c48:
      this_01 = (UVector *)0x0;
    }
    else {
      UVector::UVector(this_01,status);
    }
  }
  *ppUVar2 = this_01;
  if (U_ZERO_ERROR < *status) {
    return;
  }
LAB_001f5c54:
  UVector::addElement(*ppUVar2,rule,status);
  this->fUpToDate = '\0';
  return;
}

Assistant:

TimeZoneRule*
RuleBasedTimeZone::findRuleInFinal(UDate date, UBool local,
                                   int32_t NonExistingTimeOpt, int32_t DuplicatedTimeOpt) const {
    if (fFinalRules == NULL) {
        return NULL;
    }

    AnnualTimeZoneRule* fr0 = (AnnualTimeZoneRule*)fFinalRules->elementAt(0);
    AnnualTimeZoneRule* fr1 = (AnnualTimeZoneRule*)fFinalRules->elementAt(1);
    if (fr0 == NULL || fr1 == NULL) {
        return NULL;
    }

    UDate start0, start1;
    UDate base;
    int32_t localDelta;

    base = date;
    if (local) {
        localDelta = getLocalDelta(fr1->getRawOffset(), fr1->getDSTSavings(),
                                   fr0->getRawOffset(), fr0->getDSTSavings(),
                                   NonExistingTimeOpt, DuplicatedTimeOpt);
        base -= localDelta;
    }
    UBool avail0 = fr0->getPreviousStart(base, fr1->getRawOffset(), fr1->getDSTSavings(), TRUE, start0);

    base = date;
    if (local) {
        localDelta = getLocalDelta(fr0->getRawOffset(), fr0->getDSTSavings(),
                                   fr1->getRawOffset(), fr1->getDSTSavings(),
                                   NonExistingTimeOpt, DuplicatedTimeOpt);
        base -= localDelta;
    }
    UBool avail1 = fr1->getPreviousStart(base, fr0->getRawOffset(), fr0->getDSTSavings(), TRUE, start1);

    if (!avail0 || !avail1) {
        if (avail0) {
            return fr0;
        } else if (avail1) {
            return fr1;
        }
        // Both rules take effect after the given time
        return NULL;
    }

    return (start0 > start1) ? fr0 : fr1;
}